

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::fastAccessDx
          (FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_> *this,int i)

{
  undefined4 in_EDX;
  Fad<Fad<double>_> *in_RSI;
  value_type *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  Fad<Fad<double>_> *this_00;
  value_type *e;
  
  this_00 = in_RSI;
  e = in_RDI;
  Fad<Fad<double>_>::fastAccessDx(in_RSI,(int)((ulong)in_RDI >> 0x20));
  FadCst<double>::val((FadCst<double> *)&in_RSI->val_);
  operator/<Fad<double>,_double,_nullptr>(e,(double)this_00);
  Fad<double>::Fad<FadBinaryDiv<Fad<double>,FadCst<double>>>
            ((Fad<double> *)this_00,
             (FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_> *)
             CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_> *)in_RSI);
  return in_RDI;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) / right_.val() ;}